

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

bool __thiscall EDLines::ValidateLineSegmentRect(EDLines *this,int *x,int *y,LineSegment *ls)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  bool bVar5;
  long lVar6;
  int k;
  long lVar7;
  int n;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  int noPoints;
  int local_4c;
  double local_48;
  undefined8 uStack_40;
  
  dVar11 = ls->b;
  if (ls->invert != 0) {
    dVar11 = 1.0 / dVar11;
  }
  dVar11 = atan(dVar11);
  local_4c = 0;
  EnumerateRectPoints(ls->sx,ls->sy,ls->ex,ls->ey,x,y,&local_4c);
  lVar10 = (long)local_4c;
  if (lVar10 < 1) {
    k = 0;
    n = 0;
  }
  else {
    local_48 = (double)(~-(ulong)(dVar11 < 0.0) & (ulong)dVar11 |
                       (ulong)(dVar11 + 3.141592653589793) & -(ulong)(dVar11 < 0.0));
    uStack_40 = 0;
    lVar7 = 0;
    n = 0;
    k = 0;
    do {
      iVar1 = y[lVar7];
      if (((0 < iVar1) && (iVar2 = x[lVar7], 0 < iVar2 && iVar1 < (this->super_ED).height + -1)) &&
         (iVar3 = (this->super_ED).width, iVar2 < iVar3 + -1)) {
        n = n + 1;
        puVar4 = (this->super_ED).srcImg;
        lVar8 = (long)((iVar1 + 1) * iVar3 + iVar2);
        lVar9 = (long)((iVar1 + -1) * iVar3 + iVar2);
        lVar6 = (long)(iVar3 * iVar1 + iVar2);
        dVar11 = NFALUT::myAtan2((double)(int)(((uint)puVar4[lVar6 + 1] +
                                                ((uint)puVar4[lVar9 + 1] - (uint)puVar4[lVar8 + -1])
                                               + ((uint)puVar4[lVar8 + 1] - (uint)puVar4[lVar9 + -1]
                                                 )) - (uint)puVar4[lVar6 + -1]),
                                 (double)(int)((((uint)puVar4[lVar9 + 1] - (uint)puVar4[lVar8 + -1])
                                               - ((uint)puVar4[lVar8] +
                                                 ((uint)puVar4[lVar8 + 1] - (uint)puVar4[lVar9 + -1]
                                                 ))) + (uint)puVar4[lVar9]));
        k = k + (uint)(ABS(local_48 - dVar11) <= this->prec ||
                      3.141592653589793 - this->prec <= ABS(local_48 - dVar11));
      }
      lVar7 = lVar7 + 1;
    } while (lVar10 != lVar7);
  }
  bVar5 = NFALUT::checkValidationByNFA(this->nfa,n,k);
  return bVar5;
}

Assistant:

bool EDLines::ValidateLineSegmentRect(int * x, int * y, LineSegment * ls)
{

	// Compute Line's angle
	double lineAngle;

	if (ls->invert == 0) {
		// y = a + bx
		lineAngle = atan(ls->b);

	}
	else {
		// x = a + by
		lineAngle = atan(1.0 / ls->b);
	} //end-else

	if (lineAngle < 0) lineAngle += M_PI;

	int noPoints = 0;

	// Enumerate all pixels that fall within the bounding rectangle
	EnumerateRectPoints(ls->sx, ls->sy, ls->ex, ls->ey, x, y, &noPoints);

	int count = 0;
	int aligned = 0;

	for (int i = 0; i<noPoints; i++) {
		int r = y[i];
		int c = x[i];

		if (r <= 0 || r >= height - 1 || c <= 0 || c >= width - 1) continue;

		count++;

		// compute gx & gy using the simple [-1 -1 -1]
		//                                  [ 1  1  1]  filter in both directions
		// Faster method below
		// A B C
		// D x E
		// F G H
		// gx = (C-A) + (E-D) + (H-F)
		// gy = (F-A) + (G-B) + (H-C)
		//
		// To make this faster: 
		// com1 = (H-A)
		// com2 = (C-F)
		// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
		//       gy = com2 - com1 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
		// 
		int com1 = srcImg[(r + 1)*width + c + 1] - srcImg[(r - 1)*width + c - 1];
		int com2 = srcImg[(r - 1)*width + c + 1] - srcImg[(r + 1)*width + c - 1];

		int gx = com1 + com2 + srcImg[r*width + c + 1] - srcImg[r*width + c - 1];
		int gy = com1 - com2 + srcImg[(r + 1)*width + c] - srcImg[(r - 1)*width + c];
		double pixelAngle = nfa->myAtan2((double)gx, (double)-gy);
		
		double diff = fabs(lineAngle - pixelAngle);

		if (diff <= prec || diff >= M_PI - prec) aligned++;
	} //end-for

	return nfa->checkValidationByNFA(count, aligned);
}